

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::Incomplete2DWrapModeCase::createTexture(Incomplete2DWrapModeCase *this)

{
  int width;
  GLsizei width_00;
  GLsizei height;
  bool bVar1;
  GLenum err;
  TestLog *this_00;
  int *piVar2;
  void *pixels;
  MessageBuilder *pMVar3;
  RGBA local_24c;
  MessageBuilder local_248;
  char *local_c8;
  char *extension;
  Vector<float,_4> local_98;
  PixelBufferAccess local_88;
  GLuint local_4c;
  undefined1 local_48 [4];
  GLuint texture;
  TextureLevel levelData;
  TextureFormat fmt;
  TestLog *log;
  Incomplete2DWrapModeCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_Tex2DCompletenessCase).m_testCtx);
  levelData.m_data.m_cap = (size_t)glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_48,(TextureFormat *)&levelData.m_data.m_cap)
  ;
  glwGenTextures(1,&local_4c);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,local_4c);
  glwTexParameteri(0xde1,0x2802,this->m_wrapS);
  glwTexParameteri(0xde1,0x2803,*(GLint *)&(this->super_Tex2DCompletenessCase).field_0x84);
  glwTexParameteri(0xde1,0x2801,0x2600);
  glwTexParameteri(0xde1,0x2800,0x2600);
  piVar2 = tcu::Vector<int,_2>::x(&this->m_size);
  width = *piVar2;
  piVar2 = tcu::Vector<int,_2>::y(&this->m_size);
  tcu::TextureLevel::setSize((TextureLevel *)local_48,width,*piVar2,1);
  tcu::TextureLevel::getAccess(&local_88,(TextureLevel *)local_48);
  tcu::Vector<float,_4>::Vector(&local_98,0.0,0.0,1.0,1.0);
  tcu::clear(&local_88,&local_98);
  piVar2 = tcu::Vector<int,_2>::x(&this->m_size);
  width_00 = *piVar2;
  piVar2 = tcu::Vector<int,_2>::y(&this->m_size);
  height = *piVar2;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&extension,(TextureLevel *)local_48);
  pixels = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&extension);
  glwTexImage2D(0xde1,0,0x1908,width_00,height,0,0x1908,0x1401,pixels);
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x1d3);
  local_c8 = "GL_OES_texture_npot";
  bVar1 = isExtensionSupported(this->m_ctxInfo,"GL_OES_texture_npot");
  if (bVar1) {
    tcu::TestLog::operator<<(&local_248,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_248,&local_c8);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [48])" supported, assuming completeness test to pass.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_248);
    tcu::RGBA::RGBA(&local_24c,0,0,0xff,0xff);
    (this->super_Tex2DCompletenessCase).m_compareColor.m_value = local_24c.m_value;
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_48);
  return;
}

Assistant:

void Incomplete2DWrapModeCase::createTexture (void)
{
	TestLog&			log			= m_testCtx.getLog();
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures(1, &texture);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	levelData.setSize(m_size.x(), m_size.y());
	clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, m_size.x(), m_size.y(), 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());

	GLU_CHECK_MSG("Set texturing state");

	const char* extension = "GL_OES_texture_npot";
	if (isExtensionSupported(m_ctxInfo, extension))
	{
		log << TestLog::Message << extension << " supported, assuming completeness test to pass." << TestLog::EndMessage;
		m_compareColor = RGBA(0,0,255,255);
	}
}